

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int get_minq_index(double maxq,double x3,double x2,double x1,aom_bit_depth_t bit_depth)

{
  int qindex;
  int iVar1;
  int low;
  int iVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = ((x3 * maxq + x2) * maxq + x1) * maxq;
  if (maxq <= dVar4) {
    dVar4 = maxq;
  }
  iVar1 = 0;
  if (2.0 < dVar4) {
    iVar2 = 0xff;
    iVar1 = 0;
    do {
      qindex = iVar2 + iVar1 >> 1;
      dVar3 = av1_convert_qindex_to_q(qindex,bit_depth);
      if (dVar3 < dVar4) {
        iVar1 = qindex + 1;
        qindex = iVar2;
      }
      iVar2 = qindex;
    } while (iVar1 < iVar2);
  }
  return iVar1;
}

Assistant:

static int get_minq_index(double maxq, double x3, double x2, double x1,
                          aom_bit_depth_t bit_depth) {
  const double minqtarget = AOMMIN(((x3 * maxq + x2) * maxq + x1) * maxq, maxq);

  // Special case handling to deal with the step from q2.0
  // down to lossless mode represented by q 1.0.
  if (minqtarget <= 2.0) return 0;

  return av1_find_qindex(minqtarget, bit_depth, 0, QINDEX_RANGE - 1);
}